

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_advanced.c
# Opt level: O2

int light_section_feature_extraction
              (light_pcapng section,_func_int_light_pcapng_void_ptr_size_t *extractor,
              void **feature_vector,size_t feature_vector_size,light_feature_t type)

{
  light_boolean lVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  size_t sStack_30;
  
  lVar1 = __is_section_header(section);
  if (lVar1 != LIGHT_TRUE) {
    return -1;
  }
  sVar4 = feature_vector_size;
  switch(type) {
  case LIGHT_FEATURE_BITMASK:
    sStack_30 = 8;
    sVar4 = 1;
    break;
  case LIGHT_FEATURE_BYTE:
    sStack_30 = 1;
    break;
  case LIGHT_FEATURE_SHORT:
    sStack_30 = 2;
    break;
  default:
    pvVar2 = *feature_vector;
    goto LAB_001035db;
  case LIGHT_FEATURE_FLOAT:
    sStack_30 = 4;
    break;
  case LIGHT_FEATURE_DOUBLE:
    sStack_30 = 8;
  }
  pvVar2 = calloc(sVar4,sStack_30);
  *feature_vector = pvVar2;
LAB_001035db:
  if (pvVar2 == (void *)0x0) {
    iVar3 = -2;
  }
  else {
    (*extractor)(section,pvVar2,feature_vector_size);
    while ((section = section->next_block, iVar3 = 0, section != (_light_pcapng *)0x0 &&
           (lVar1 = __is_section_header(section), iVar3 = 0, lVar1 != LIGHT_TRUE))) {
      (*extractor)(section,*feature_vector,feature_vector_size);
    }
  }
  return iVar3;
}

Assistant:

int light_section_feature_extraction(const light_pcapng section, int (*extractor)(const light_pcapng, void *, size_t),
		void **feature_vector, const size_t feature_vector_size, const light_feature_t type)
{
	light_pcapng iterator;

	if (__is_section_header(section) != LIGHT_TRUE) {
		return LIGHT_INVALID_SECTION;
	}

	switch(type) {
	case LIGHT_FEATURE_BITMASK:
		*feature_vector = calloc(1, sizeof(uint64_t));
		break;
	case LIGHT_FEATURE_BYTE:
		*feature_vector = calloc(feature_vector_size, sizeof(uint8_t));
		break;
	case LIGHT_FEATURE_SHORT:
		*feature_vector = calloc(feature_vector_size, sizeof(uint16_t));
		break;
	case LIGHT_FEATURE_FLOAT:
		*feature_vector = calloc(feature_vector_size, sizeof(float));
		break;
	case LIGHT_FEATURE_DOUBLE:
		*feature_vector = calloc(feature_vector_size, sizeof(double));
		break;
	}

	if (*feature_vector == NULL) {
		return LIGHT_OUT_OF_MEMORY;
	}

	extractor(section, *feature_vector, feature_vector_size);
	iterator = section->next_block;
	while (iterator != NULL && __is_section_header(iterator) != LIGHT_TRUE) {
		extractor(iterator, *feature_vector, feature_vector_size);
		iterator = iterator->next_block;
	}

	return LIGHT_SUCCESS;
}